

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O2

void __thiscall mini_bus::MiniBusEncoder::insert_varuint(MiniBusEncoder *this,uint64_t vuit)

{
  std::__cxx11::string::reserve((ulong)this);
  for (; 0x7f < vuit; vuit = vuit >> 7) {
    std::__cxx11::string::push_back((char)this);
  }
  std::__cxx11::string::push_back((char)this);
  return;
}

Assistant:

inline void insert_varuint(uint64_t vuit) {
    buffer.reserve(buffer.size() + vuit + 16);
    while (true) {
      if (vuit < 128) {
        buffer += (unsigned char) vuit;
        break;
      }
      buffer += (unsigned char) (0b10000000 | (vuit & 0b01111111));
      vuit >>= 7;
    }
  }